

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O2

void dwt_encode_1_real(int *a,int dn,int sn,int cas)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int *piVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  
  if (cas == 0) {
    if (0 < dn || 1 < sn) {
      lVar11 = (long)(sn * 2 + -2);
      lVar8 = 0;
      uVar1 = 0;
      if (0 < dn) {
        uVar1 = (ulong)(uint)dn;
      }
      uVar4 = 0;
      while (uVar1 != uVar4) {
        lVar13 = lVar11;
        if ((long)uVar4 < (long)sn) {
          lVar13 = lVar8;
        }
        lVar8 = lVar8 + 2;
        lVar12 = lVar11;
        if ((int)(uVar4 + 1) < sn) {
          lVar12 = lVar8;
        }
        lVar13 = ((long)a[lVar12] + (long)a[lVar13]) * 0x32c1;
        a[uVar4 * 2 + 1] = a[uVar4 * 2 + 1] - (int)((ulong)((uint)lVar13 & 0x1000) + lVar13 >> 0xd);
        uVar4 = uVar4 + 1;
      }
      uVar2 = 0xffffffff;
      lVar13 = (long)(dn * 2 + -1);
      lVar8 = (long)dn;
      uVar14 = 0;
      uVar4 = 0;
      if (0 < sn) {
        uVar4 = (ulong)(uint)sn;
      }
      lVar12 = 1;
      uVar15 = 0xffffffff;
      for (; uVar4 != uVar14; uVar14 = uVar14 + 1) {
        piVar6 = a + 1;
        if ((uVar14 != 0) && (piVar6 = a + lVar13, (long)uVar14 <= lVar8)) {
          piVar6 = a + (uVar15 & 0xffffffff);
        }
        lVar9 = lVar13;
        if ((long)uVar14 < lVar8) {
          lVar9 = lVar12;
        }
        lVar9 = ((long)a[lVar9] + (long)*piVar6) * 0x1b2;
        a[uVar14 * 2] = a[uVar14 * 2] - (int)((ulong)((uint)lVar9 & 0x1000) + lVar9 >> 0xd);
        uVar15 = uVar15 + 2;
        lVar12 = lVar12 + 2;
      }
      lVar12 = 0;
      uVar14 = 0;
      while (uVar1 != uVar14) {
        lVar9 = lVar11;
        if ((long)uVar14 < (long)sn) {
          lVar9 = lVar12;
        }
        lVar12 = lVar12 + 2;
        lVar7 = lVar11;
        if ((int)(uVar14 + 1) < sn) {
          lVar7 = lVar12;
        }
        lVar9 = ((long)a[lVar7] + (long)a[lVar9]) * 0x1c41;
        a[uVar14 * 2 + 1] = a[uVar14 * 2 + 1] + (int)((ulong)((uint)lVar9 & 0x1000) + lVar9 >> 0xd);
        uVar14 = uVar14 + 1;
      }
      lVar11 = 1;
      for (uVar14 = 0; uVar4 != uVar14; uVar14 = uVar14 + 1) {
        piVar6 = a + 1;
        if ((uVar14 != 0) && (piVar6 = a + lVar13, (long)uVar14 <= lVar8)) {
          piVar6 = a + uVar2;
        }
        lVar12 = lVar13;
        if ((long)uVar14 < lVar8) {
          lVar12 = lVar11;
        }
        lVar12 = ((long)a[lVar12] + (long)*piVar6) * 0xe31;
        a[uVar14 * 2] = a[uVar14 * 2] + (int)((ulong)((uint)lVar12 & 0x1000) + lVar12 >> 0xd);
        uVar2 = uVar2 + 2;
        lVar11 = lVar11 + 2;
      }
      for (uVar14 = 0; uVar1 != uVar14; uVar14 = uVar14 + 1) {
        a[uVar14 * 2 + 1] =
             (int)((ulong)((uint)((long)a[uVar14 * 2 + 1] * 0x13ae) & 0x1000) +
                   (long)a[uVar14 * 2 + 1] * 0x13ae >> 0xd);
      }
      for (uVar1 = 0; uVar4 != uVar1; uVar1 = uVar1 + 1) {
        a[uVar1 * 2] = (int)((ulong)((uint)((long)a[uVar1 * 2] * 0x1a03) & 0x1000) +
                             (long)a[uVar1 * 2] * 0x1a03 >> 0xd);
      }
    }
  }
  else if (1 < dn || 0 < sn) {
    uVar2 = 0xffffffff;
    lVar8 = (long)(sn * 2 + -1);
    lVar11 = (long)sn;
    uVar4 = 0;
    uVar1 = 0;
    if (0 < dn) {
      uVar1 = (ulong)(uint)dn;
    }
    lVar13 = 1;
    uVar14 = 0xffffffff;
    for (; uVar1 != uVar4; uVar4 = uVar4 + 1) {
      lVar12 = lVar8;
      if ((long)uVar4 < lVar11) {
        lVar12 = lVar13;
      }
      piVar6 = a + 1;
      if ((uVar4 != 0) && (piVar6 = a + lVar8, (long)uVar4 <= lVar11)) {
        piVar6 = a + (uVar14 & 0xffffffff);
      }
      lVar12 = ((long)*piVar6 + (long)a[lVar12]) * 0x32c1;
      a[uVar4 * 2] = a[uVar4 * 2] - (int)((ulong)((uint)lVar12 & 0x1000) + lVar12 >> 0xd);
      uVar14 = uVar14 + 2;
      lVar13 = lVar13 + 2;
    }
    uVar14 = (ulong)(dn * 2 + -2);
    uVar15 = 0;
    uVar4 = (ulong)(uint)sn;
    if (sn < 1) {
      uVar4 = uVar15;
    }
    uVar3 = 0;
    while (uVar4 != uVar3) {
      uVar10 = uVar14;
      if ((long)uVar3 < (long)dn) {
        uVar10 = uVar15;
      }
      uVar15 = uVar15 + 2;
      uVar5 = uVar14;
      if ((int)(uVar3 + 1) < dn) {
        uVar5 = uVar15;
      }
      lVar13 = ((long)a[uVar5] + (long)a[uVar10]) * 0x1b2;
      a[uVar3 * 2 + 1] = a[uVar3 * 2 + 1] - (int)((ulong)((uint)lVar13 & 0x1000) + lVar13 >> 0xd);
      uVar3 = uVar3 + 1;
    }
    lVar13 = 1;
    for (uVar15 = 0; uVar1 != uVar15; uVar15 = uVar15 + 1) {
      lVar12 = lVar8;
      if ((long)uVar15 < lVar11) {
        lVar12 = lVar13;
      }
      piVar6 = a + 1;
      if ((uVar15 != 0) && (piVar6 = a + lVar8, (long)uVar15 <= lVar11)) {
        piVar6 = a + uVar2;
      }
      lVar12 = ((long)*piVar6 + (long)a[lVar12]) * 0x1c41;
      a[uVar15 * 2] = a[uVar15 * 2] + (int)((ulong)((uint)lVar12 & 0x1000) + lVar12 >> 0xd);
      uVar2 = uVar2 + 2;
      lVar13 = lVar13 + 2;
    }
    uVar3 = 0;
    uVar15 = 0;
    while (uVar4 != uVar15) {
      uVar10 = uVar14;
      if ((long)uVar15 < (long)dn) {
        uVar10 = uVar3;
      }
      uVar3 = uVar3 + 2;
      uVar5 = uVar14;
      if ((int)(uVar15 + 1) < dn) {
        uVar5 = uVar3;
      }
      lVar8 = ((long)a[uVar5] + (long)a[uVar10]) * 0xe31;
      a[uVar15 * 2 + 1] = a[uVar15 * 2 + 1] + (int)((ulong)((uint)lVar8 & 0x1000) + lVar8 >> 0xd);
      uVar15 = uVar15 + 1;
    }
    for (uVar14 = 0; uVar1 != uVar14; uVar14 = uVar14 + 1) {
      a[uVar14 * 2] =
           (int)((ulong)((uint)((long)a[uVar14 * 2] * 0x13ae) & 0x1000) +
                 (long)a[uVar14 * 2] * 0x13ae >> 0xd);
    }
    for (uVar1 = 0; uVar4 != uVar1; uVar1 = uVar1 + 1) {
      a[uVar1 * 2 + 1] =
           (int)((ulong)((uint)((long)a[uVar1 * 2 + 1] * 0x1a03) & 0x1000) +
                 (long)a[uVar1 * 2 + 1] * 0x1a03 >> 0xd);
    }
  }
  return;
}

Assistant:

static void dwt_encode_1_real(int *a, int dn, int sn, int cas) {
	int i;
	if (!cas) {
		if ((dn > 0) || (sn > 1)) {	/* NEW :  CASE ONE ELEMENT */
			for (i = 0; i < dn; i++)
				D(i) -= fix_mul(S_(i) + S_(i + 1), 12993);
			for (i = 0; i < sn; i++)
				S(i) -= fix_mul(D_(i - 1) + D_(i), 434);
			for (i = 0; i < dn; i++)
				D(i) += fix_mul(S_(i) + S_(i + 1), 7233);
			for (i = 0; i < sn; i++)
				S(i) += fix_mul(D_(i - 1) + D_(i), 3633);
			for (i = 0; i < dn; i++)
				D(i) = fix_mul(D(i), 5038);	/*5038 */
			for (i = 0; i < sn; i++)
				S(i) = fix_mul(S(i), 6659);	/*6660 */
		}
	} else {
		if ((sn > 0) || (dn > 1)) {	/* NEW :  CASE ONE ELEMENT */
			for (i = 0; i < dn; i++)
				S(i) -= fix_mul(DD_(i) + DD_(i - 1), 12993);
			for (i = 0; i < sn; i++)
				D(i) -= fix_mul(SS_(i) + SS_(i + 1), 434);
			for (i = 0; i < dn; i++)
				S(i) += fix_mul(DD_(i) + DD_(i - 1), 7233);
			for (i = 0; i < sn; i++)
				D(i) += fix_mul(SS_(i) + SS_(i + 1), 3633);
			for (i = 0; i < dn; i++)
				S(i) = fix_mul(S(i), 5038);	/*5038 */
			for (i = 0; i < sn; i++)
				D(i) = fix_mul(D(i), 6659);	/*6660 */
		}
	}
}